

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_posix.c
# Opt level: O2

wchar_t archive_read_disk_set_metadata_filter_callback
                  (archive *_a,
                  _func_int_archive_ptr_void_ptr_archive_entry_ptr *_metadata_filter_func,
                  void *_client_data)

{
  int iVar1;
  wchar_t wVar2;
  
  iVar1 = __archive_check_magic
                    (_a,0xbadb0c5,0x7fff,"archive_read_disk_set_metadata_filter_callback");
  if (iVar1 == -0x1e) {
    wVar2 = L'\xffffffe2';
  }
  else {
    _a[1].sconv = (archive_string_conv *)_metadata_filter_func;
    _a[1].read_data_block = (char *)_client_data;
    wVar2 = L'\0';
  }
  return wVar2;
}

Assistant:

int
archive_read_disk_set_metadata_filter_callback(struct archive *_a,
    int (*_metadata_filter_func)(struct archive *, void *,
    struct archive_entry *), void *_client_data)
{
	struct archive_read_disk *a = (struct archive_read_disk *)_a;

	archive_check_magic(_a, ARCHIVE_READ_DISK_MAGIC, ARCHIVE_STATE_ANY,
	    "archive_read_disk_set_metadata_filter_callback");

	a->metadata_filter_func = _metadata_filter_func;
	a->metadata_filter_data = _client_data;
	return (ARCHIVE_OK);
}